

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteSFixed64
               (int field_number,int64 value,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  int64 value_local;
  int field_number_local;
  
  WriteTag(field_number,WIRETYPE_FIXED64,output);
  WriteSFixed64NoTag(value,output);
  return;
}

Assistant:

void WireFormatLite::WriteSFixed64(int field_number, int64 value,
                                   io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED64, output);
  WriteSFixed64NoTag(value, output);
}